

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void print_rdebug_grammar(Grammar *g,char *pathname)

{
  char local_38 [8];
  char ver [30];
  char *pathname_local;
  Grammar *g_local;
  
  unique0x10000096 = pathname;
  d_version(local_38);
  printf("/*\n  Generated by Make DParser Version %s\n",local_38);
  printf("  Available at http://dparser.sf.net\n*/\n\n");
  print_global_code(g);
  print_declarations(g);
  print_productions(g,stack0xffffffffffffffe8);
  return;
}

Assistant:

void print_rdebug_grammar(Grammar *g, char *pathname) {
  char ver[30];
  d_version(ver);

  printf("/*\n  Generated by Make DParser Version %s\n", ver);
  printf("  Available at http://dparser.sf.net\n*/\n\n");

  print_global_code(g);
  print_declarations(g);
  print_productions(g, pathname);
}